

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init_tests.cpp
# Opt level: O2

void wallet::init_tests::walletinit_verify_walletdir_is_not_directory_invoker(void)

{
  long lVar1;
  unit_test_log_t *puVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  iterator in_R8;
  iterator in_R9;
  long in_FS_OFFSET;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  pointer local_720;
  pointer local_718;
  char *local_710;
  char *local_708;
  pointer local_700;
  pointer local_6f8;
  char *local_6f0;
  char *local_6e8;
  pointer local_6e0;
  pointer local_6d8;
  char *local_6d0;
  char *local_6c8;
  pointer local_6c0;
  pointer local_6b8;
  char *local_6b0;
  char *local_6a8;
  pointer local_6a0;
  pointer local_698;
  char *local_690;
  char *local_688;
  basic_wrap_stringstream<char> local_680;
  walletinit_verify_walletdir_is_not_directory t;
  
  puVar2 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  local_690 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/init_tests.cpp"
  ;
  local_688 = "";
  memset((basic_wrap_stringstream<char> *)&t,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream((basic_wrap_stringstream<char> *)&t)
  ;
  std::operator<<((ostream *)&t,'\"');
  std::operator<<((ostream *)&t,"walletinit_verify_walletdir_is_not_directory");
  std::operator<<((ostream *)&t,"\" fixture ctor");
  pbVar3 = boost::basic_wrap_stringstream<char>::str_abi_cxx11_((basic_wrap_stringstream<char> *)&t)
  ;
  local_6a0 = (pbVar3->_M_dataplus)._M_p;
  local_698 = local_6a0 + pbVar3->_M_string_length;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  file.m_end = (iterator)0x2e;
  file.m_begin = (iterator)&local_690;
  boost::unit_test::unit_test_log_t::set_checkpoint(puVar2,file,(size_t)&local_6a0,msg);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream
            ((basic_wrap_stringstream<char> *)&t);
  walletinit_verify_walletdir_is_not_directory::walletinit_verify_walletdir_is_not_directory(&t);
  puVar2 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  local_6b0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/init_tests.cpp"
  ;
  local_6a8 = "";
  memset(&local_680,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(&local_680);
  std::operator<<((ostream *)&local_680,'\"');
  std::operator<<((ostream *)&local_680,"walletinit_verify_walletdir_is_not_directory");
  std::operator<<((ostream *)&local_680,"\" fixture setup");
  pbVar3 = boost::basic_wrap_stringstream<char>::str_abi_cxx11_(&local_680);
  local_6c0 = (pbVar3->_M_dataplus)._M_p;
  local_6b8 = local_6c0 + pbVar3->_M_string_length;
  msg_00.m_end = in_R9;
  msg_00.m_begin = in_R8;
  file_00.m_end = (iterator)0x2e;
  file_00.m_begin = (iterator)&local_6b0;
  boost::unit_test::unit_test_log_t::set_checkpoint(puVar2,file_00,(size_t)&local_6c0,msg_00);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(&local_680);
  puVar2 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  local_6d0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/init_tests.cpp"
  ;
  local_6c8 = "";
  memset(&local_680,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(&local_680);
  std::operator<<((ostream *)&local_680,'\"');
  std::operator<<((ostream *)&local_680,"walletinit_verify_walletdir_is_not_directory");
  std::operator<<((ostream *)&local_680,"\" test entry");
  pbVar3 = boost::basic_wrap_stringstream<char>::str_abi_cxx11_(&local_680);
  local_6e0 = (pbVar3->_M_dataplus)._M_p;
  local_6d8 = local_6e0 + pbVar3->_M_string_length;
  msg_01.m_end = in_R9;
  msg_01.m_begin = in_R8;
  file_01.m_end = (iterator)0x2e;
  file_01.m_begin = (iterator)&local_6d0;
  boost::unit_test::unit_test_log_t::set_checkpoint(puVar2,file_01,(size_t)&local_6e0,msg_01);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(&local_680);
  walletinit_verify_walletdir_is_not_directory::test_method(&t);
  puVar2 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  local_6f0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/init_tests.cpp"
  ;
  local_6e8 = "";
  memset(&local_680,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(&local_680);
  std::operator<<((ostream *)&local_680,'\"');
  std::operator<<((ostream *)&local_680,"walletinit_verify_walletdir_is_not_directory");
  std::operator<<((ostream *)&local_680,"\" fixture teardown");
  pbVar3 = boost::basic_wrap_stringstream<char>::str_abi_cxx11_(&local_680);
  local_700 = (pbVar3->_M_dataplus)._M_p;
  local_6f8 = local_700 + pbVar3->_M_string_length;
  msg_02.m_end = in_R9;
  msg_02.m_begin = in_R8;
  file_02.m_end = (iterator)0x2e;
  file_02.m_begin = (iterator)&local_6f0;
  boost::unit_test::unit_test_log_t::set_checkpoint(puVar2,file_02,(size_t)&local_700,msg_02);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(&local_680);
  puVar2 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  local_710 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/init_tests.cpp"
  ;
  local_708 = "";
  memset(&local_680,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(&local_680);
  std::operator<<((ostream *)&local_680,'\"');
  std::operator<<((ostream *)&local_680,"walletinit_verify_walletdir_is_not_directory");
  std::operator<<((ostream *)&local_680,"\" fixture dtor");
  pbVar3 = boost::basic_wrap_stringstream<char>::str_abi_cxx11_(&local_680);
  local_720 = (pbVar3->_M_dataplus)._M_p;
  local_718 = local_720 + pbVar3->_M_string_length;
  msg_03.m_end = in_R9;
  msg_03.m_begin = in_R8;
  file_03.m_end = (iterator)0x2e;
  file_03.m_begin = (iterator)&local_710;
  boost::unit_test::unit_test_log_t::set_checkpoint(puVar2,file_03,(size_t)&local_720,msg_03);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(&local_680);
  InitWalletDirTestingSetup::~InitWalletDirTestingSetup(&t.super_BOOST_AUTO_TEST_CASE_FIXTURE);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(walletinit_verify_walletdir_is_not_directory)
{
    SetWalletDir(m_walletdir_path_cases["file"]);
    {
        ASSERT_DEBUG_LOG("is not a directory");
        bool result = m_wallet_loader->verify();
        BOOST_CHECK(result == false);
    }
}